

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O3

void __thiscall Js::Profiler::Print(Profiler *this,Phase baseTag)

{
  anon_class_32_4_bc7babac visit;
  int iVar1;
  undefined6 in_register_00000032;
  int iVar2;
  TimeStamp local_58;
  TimeStamp freq;
  Phase *pPStack_48;
  TimeStamp *local_40;
  Profiler *pPStack_38;
  Phase local_2c;
  char local_29 [8];
  bool foundNode;
  
  iVar1 = (int)CONCAT62(in_register_00000032,baseTag);
  iVar2 = 0;
  if (iVar1 != 0x176) {
    iVar2 = iVar1;
  }
  local_2c = (Phase)iVar2;
  local_58 = GetFrequency();
  local_40 = &local_58;
  freq = (TimeStamp)local_29;
  local_29[0] = '\0';
  visit.baseTag = &local_2c;
  visit.foundNode = (bool *)freq;
  visit.freq = local_40;
  visit.this = this;
  pPStack_48 = &local_2c;
  pPStack_38 = this;
  ForEachNode<Js::Profiler::Print(Js::Phase)::__0>((Phase)iVar2,&this->rootNode,visit,InvalidPhase);
  if (local_29[0] == '\x01') {
    Output::Print(
                 L"-------------------------------------------------------------------------------\n"
                 );
    Output::Flush();
  }
  return;
}

Assistant:

void
    Profiler::Print(Phase baseTag)
    {
        if (baseTag == InvalidPhase)
        {
            baseTag = AllPhase;     // default to all phase
        }
        const TimeStamp freq = this->GetFrequency();

        bool foundNode = false;
        ForEachNode(baseTag, &rootNode, [&](TypeNode *const baseNode, const Phase parentTag)
        {
            if(!foundNode)
            {
                foundNode = true;
                Output::Print(_u("%-*s:%7s %5s %7s %5s %7s %7s %5s\n"),
                                (Profiler::PhaseNameWidth-0),
                                _u("Profiler Report"),
                                _u("Incl"),
                                _u("(%)"),
                                _u("Excl"),
                                _u("(%)"),
                                _u("Max"),
                                _u("Mean"),
                                _u("Count")
                                );
                Output::Print(_u("-------------------------------------------------------------------------------\n"));
            }

            UnitData *data      = baseNode->GetValue();

            if(0 == data->count)
            {
                Output::Print(_u("The phase : %s was never started"), PhaseNames[baseTag]);
                return;
            }

            int indent = 0;

            if(parentTag != InvalidPhase)
            {
                TypeNode *const parentNode = baseNode->GetParent();
                Assert(parentNode);

                Output::Print(_u("%-*s\n"), (Profiler::PhaseNameWidth-0), PhaseNames[parentTag]);
                indent += Profiler::TabWidth;
            }

            if(indent)
            {
                Output::SkipToColumn(indent);
            }
            Output::Print(_u("%-*s %7.1f %5d %7.1f %5d %7.1f %7.1f %5d\n"),
                    (Profiler::PhaseNameWidth-indent),
                    PhaseNames[baseTag],
                    (double)data->incl / freq ,                 // incl
                    int(100),                                   // incl %
                    (double)data->excl / freq ,                 // excl
                    int(data->excl * 100 / data->incl ),        // excl %
                    (double)data->max  / freq ,                 // max
                    (double)data->incl / ( freq * data->count ),// mean
                    int(data->count)                            // count
                    );
            indent += Profiler::TabWidth;

            PrintTree(baseNode, baseNode, indent, freq);
        });

        if(foundNode)
        {
            Output::Print(_u("-------------------------------------------------------------------------------\n"));
            Output::Flush();
        }
    }